

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O2

void __thiscall TxRequestTracker::Impl::SanityCheck(Impl *this)

{
  _Link_type b;
  _Head_base<2UL,_const_unsigned_long_&,_false> _Var1;
  _Hash_node_base _Var2;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
  *poVar3;
  pointer poVar4;
  _Base_ptr p_Var5;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  unsigned_long uVar9;
  _Base_ptr p_Var10;
  _Tuple_impl<2UL,_const_unsigned_long_&> _Var11;
  bool bVar12;
  mapped_type *pmVar13;
  __node_base *p_Var14;
  _Rb_tree_node_base *p_Var15;
  _Rb_tree_node_base *p_Var16;
  _Rb_tree_node_base *p_Var17;
  Priority PVar18;
  _Base_ptr p_Var19;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var20;
  _Hash_node_base *p_Var21;
  ulong uVar22;
  _Link_type __p;
  Announcement *ann;
  _Hash_node_base *p_Var23;
  _Link_type b_00;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar24;
  tuple<const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&> local_a0;
  tuple<const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&> local_88;
  undefined1 local_70 [16];
  __node_base local_60;
  _Base_ptr p_Stack_58;
  _Rb_tree_node_base *local_50;
  size_t local_48;
  __node_base_ptr p_Stack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_70._0_8_ = &p_Stack_40;
  local_70._8_8_ = 1;
  local_60._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_58 = (_Base_ptr)0x0;
  local_50 = (_Rb_tree_node_base *)CONCAT44(local_50._4_4_,1.0);
  local_48 = 0;
  p_Stack_40 = (__node_base_ptr)0x0;
  _Var1._M_head_impl =
       (unsigned_long *)
       (this->m_index).
       super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
       .member;
  _Var2._M_nxt = (_Hash_node_base *)_Var1._M_head_impl[0xe];
  local_88.
  super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>.
  super__Tuple_impl<1UL,_const_unsigned_long_&,_const_unsigned_long_&>.
  super__Tuple_impl<2UL,_const_unsigned_long_&>.super__Head_base<2UL,_const_unsigned_long_&,_false>.
  _M_head_impl = (_Head_base<2UL,_const_unsigned_long_&,_false>)(_Var2._M_nxt + -0xd);
  if (_Var2._M_nxt == (_Hash_node_base *)0x0) {
    local_88.
    super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>.
    super__Tuple_impl<1UL,_const_unsigned_long_&,_const_unsigned_long_&>.
    super__Tuple_impl<2UL,_const_unsigned_long_&>.
    super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl =
         (_Head_base<2UL,_const_unsigned_long_&,_false>)(unsigned_long *)0x0;
  }
  while (_Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl =
              local_88.
              super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>
              .super__Tuple_impl<1UL,_const_unsigned_long_&,_const_unsigned_long_&>.
              super__Tuple_impl<2UL,_const_unsigned_long_&>.
              super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl,
        local_88.
        super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>.
        super__Tuple_impl<1UL,_const_unsigned_long_&,_const_unsigned_long_&>.
        super__Tuple_impl<2UL,_const_unsigned_long_&>.
        super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl !=
        (_Head_base<2UL,_const_unsigned_long_&,_false>)_Var1._M_head_impl) {
    pmVar13 = std::
              unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
              ::operator[]((unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
                            *)local_70,
                           (key_type *)
                           ((long)local_88.
                                  super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>
                                  .
                                  super__Tuple_impl<1UL,_const_unsigned_long_&,_const_unsigned_long_&>
                                  .super__Tuple_impl<2UL,_const_unsigned_long_&>.
                                  super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl +
                           0x28));
    pmVar13->m_total = pmVar13->m_total + 1;
    pmVar13->m_requested =
         pmVar13->m_requested +
         (ulong)(((ulong)((_Hash_node_base *)
                         ((long)_Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>.
                                _M_head_impl + 0x30))->_M_nxt & 0xe000000000000000) ==
                0x6000000000000000);
    pmVar13->m_completed = pmVar13->m_completed;
    boost::multi_index::detail::
    ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
    ::increment((ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 **)&local_88);
  }
  if ((_Base_ptr)(this->m_peerinfo)._M_h._M_element_count != p_Stack_58) {
LAB_00358135:
    __assert_fail("m_peerinfo == RecomputePeerInfo(m_index)",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                  ,0x149,"void TxRequestTracker::Impl::SanityCheck() const");
  }
  p_Var14 = &(this->m_peerinfo)._M_h._M_before_begin;
LAB_00358091:
  p_Var14 = p_Var14->_M_nxt;
  if (p_Var14 != (__node_base *)0x0) {
    uVar22 = (ulong)p_Var14[1]._M_nxt % (ulong)local_70._8_8_;
    if (*(__node_base_ptr *)(local_70._0_8_ + uVar22 * 8) != (__node_base_ptr)0x0) {
      p_Var23 = (*(__node_base_ptr *)(local_70._0_8_ + uVar22 * 8))->_M_nxt;
      p_Var21 = p_Var23[1]._M_nxt;
      do {
        if (p_Var21 == p_Var14[1]._M_nxt) {
          local_88.
          super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>
          .super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl =
               (unsigned_long *)(p_Var23 + 2);
          local_88.
          super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>
          .super__Tuple_impl<1UL,_const_unsigned_long_&,_const_unsigned_long_&>.
          super__Head_base<1UL,_const_unsigned_long_&,_false>._M_head_impl =
               (unsigned_long *)(p_Var23 + 3);
          local_88.
          super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>
          .super__Tuple_impl<1UL,_const_unsigned_long_&,_const_unsigned_long_&>.
          super__Tuple_impl<2UL,_const_unsigned_long_&>.
          super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl =
               (_Head_base<2UL,_const_unsigned_long_&,_false>)(p_Var23 + 4);
          local_a0.
          super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>
          .super__Tuple_impl<1UL,_const_unsigned_long_&,_const_unsigned_long_&>.
          super__Tuple_impl<2UL,_const_unsigned_long_&>.
          super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl =
               (_Head_base<2UL,_const_unsigned_long_&,_false>)
               (_Head_base<2UL,_const_unsigned_long_&,_false>)(p_Var14 + 4);
          local_a0.
          super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>
          .super__Tuple_impl<1UL,_const_unsigned_long_&,_const_unsigned_long_&>.
          super__Head_base<1UL,_const_unsigned_long_&,_false>._M_head_impl =
               (unsigned_long *)(p_Var14 + 3);
          local_a0.
          super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>
          .super__Head_base<0UL,_const_unsigned_long_&,_false>._M_head_impl =
               (unsigned_long *)(p_Var14 + 2);
          bVar12 = std::
                   __tuple_compare<std::tuple<const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>,_std::tuple<const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>,_0UL,_3UL>
                   ::__eq(&local_88,&local_a0);
          if (bVar12) goto LAB_00358091;
        }
        p_Var23 = p_Var23->_M_nxt;
        if ((p_Var23 == (_Hash_node_base *)0x0) ||
           (p_Var21 = p_Var23[1]._M_nxt, (ulong)p_Var21 % (ulong)local_70._8_8_ != uVar22)) break;
      } while( true );
    }
    goto LAB_00358135;
  }
  std::
  unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
  ::~unordered_map((unordered_map<long,_(anonymous_namespace)::PeerInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_(anonymous_namespace)::PeerInfo>_>_>
                    *)local_70);
  local_70._8_8_ = local_70._8_8_ & 0xffffffff00000000;
  local_60._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_58 = (_Rb_tree_node_base *)(local_70 + 8);
  local_50 = (_Rb_tree_node_base *)(local_70 + 8);
  local_48 = 0;
  poVar3 = (this->m_index).
           super_header_holder<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>_*,_boost::multi_index::multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>_>
           .member;
  poVar4 = (poVar3->
           super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
           ).
           super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .
           super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
           .super_type.left_;
  local_88.
  super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>.
  super__Tuple_impl<1UL,_const_unsigned_long_&,_const_unsigned_long_&>.
  super__Tuple_impl<2UL,_const_unsigned_long_&>.super__Head_base<2UL,_const_unsigned_long_&,_false>.
  _M_head_impl = (_Head_base<2UL,_const_unsigned_long_&,_false>)
                 &poVar4[-5].
                  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                  .super_type.right_;
  if (poVar4 == (pointer)0x0) {
    local_88.
    super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>.
    super__Tuple_impl<1UL,_const_unsigned_long_&,_const_unsigned_long_&>.
    super__Tuple_impl<2UL,_const_unsigned_long_&>.
    super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl =
         (_Head_base<2UL,_const_unsigned_long_&,_false>)(unsigned_long *)0x0;
  }
  do {
    _Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl =
         (_Head_base<2UL,_const_unsigned_long_&,_false>)
         (_Head_base<2UL,_const_unsigned_long_&,_false>)
         local_88.
         super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>
         .super__Tuple_impl<1UL,_const_unsigned_long_&,_const_unsigned_long_&>.
         super__Tuple_impl<2UL,_const_unsigned_long_&>;
    p_Var17 = (_Rb_tree_node_base *)(local_70 + 8);
    p_Var14 = &local_60;
    p_Var15 = p_Stack_58;
    p_Var16 = p_Var17;
    if (local_88.
        super__Tuple_impl<0UL,_const_unsigned_long_&,_const_unsigned_long_&,_const_unsigned_long_&>.
        super__Tuple_impl<1UL,_const_unsigned_long_&,_const_unsigned_long_&>.
        super__Tuple_impl<2UL,_const_unsigned_long_&>.
        super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl ==
        (_Head_base<2UL,_const_unsigned_long_&,_false>)poVar3) {
      while( true ) {
        if (p_Var15 == p_Var17) {
          std::
          map<uint256,_(anonymous_namespace)::TxHashInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
          ::~map((map<uint256,_(anonymous_namespace)::TxHashInfo,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
                  *)local_70);
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
            __stack_chk_fail();
          }
          return;
        }
        p_Var19 = p_Var15[2]._M_parent;
        p_Var5 = p_Var15[2]._M_left;
        if ((long)&(p_Var15[2]._M_right)->_M_color +
            (long)&p_Var5->_M_color + (long)&p_Var19->_M_color + *(long *)(p_Var15 + 2) == 0) {
          __assert_fail("info.m_candidate_delayed + info.m_candidate_ready + info.m_candidate_best + info.m_requested > 0"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                        ,0x150,"void TxRequestTracker::Impl::SanityCheck() const");
        }
        uVar22 = (long)&p_Var5->_M_color + (long)&(p_Var15[2]._M_right)->_M_color;
        if (1 < uVar22) {
          __assert_fail("info.m_candidate_best + info.m_requested <= 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                        ,0x153,"void TxRequestTracker::Impl::SanityCheck() const");
        }
        if (uVar22 != 1 && p_Var19 != (_Base_ptr)0x0) break;
        if ((p_Var5 != (_Base_ptr)0x0 && p_Var19 != (_Base_ptr)0x0) &&
           (*(_Base_ptr *)(p_Var15 + 3) < p_Var15[3]._M_parent)) {
          __assert_fail("info.m_priority_candidate_best >= info.m_priority_best_candidate_ready",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                        ,0x15e,"void TxRequestTracker::Impl::SanityCheck() const");
        }
        std::
        __sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (p_Var15[3]._M_left,p_Var15[3]._M_right);
        _Var20 = std::
                 __adjacent_find<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                           (p_Var15[3]._M_left,p_Var15[3]._M_right);
        if ((_Base_ptr)_Var20._M_current != p_Var15[3]._M_right) {
          __assert_fail("std::adjacent_find(info.m_peers.begin(), info.m_peers.end()) == info.m_peers.end()"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                        ,0x163,"void TxRequestTracker::Impl::SanityCheck() const");
        }
        p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var15);
      }
      __assert_fail("info.m_candidate_best + info.m_requested == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txrequest.cpp"
                    ,0x158,"void TxRequestTracker::Impl::SanityCheck() const");
    }
    while( true ) {
      pVar6.second = p_Var16;
      pVar6.first = p_Var16;
      p_Var15 = (_Rb_tree_node_base *)p_Var14->_M_nxt;
      if (p_Var15 == (_Rb_tree_node_base *)0x0) break;
      bVar12 = ::operator<((base_blob<256U> *)(p_Var15 + 1),
                           (base_blob<256U> *)
                           _Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl);
      if (!bVar12) {
        p_Var16 = p_Var15;
      }
      p_Var14 = (__node_base *)((long)&p_Var15->_M_left + (ulong)bVar12 * 8);
    }
    if ((p_Var16 == p_Var17) ||
       (bVar12 = ::operator<((base_blob<256U> *)
                             _Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl
                             ,(base_blob<256U> *)(p_Var16 + 1)), bVar12)) {
      p_Var15 = (_Rb_tree_node_base *)operator_new(0x88);
      uVar9 = *(unsigned_long *)
               _Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl;
      p_Var19 = *(_Base_ptr *)
                 ((long)_Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl + 8)
      ;
      p_Var5 = *(_Base_ptr *)
                ((long)_Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl +
                0x10);
      p_Var10 = *(_Base_ptr *)
                 ((long)_Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl +
                 0x18);
      *(undefined8 *)(p_Var15 + 3) = 0xffffffffffffffff;
      b_00 = (_Link_type)(p_Var15 + 1);
      p_Var15[1]._M_left = p_Var5;
      p_Var15[1]._M_right = p_Var10;
      *(unsigned_long *)(p_Var15 + 1) = uVar9;
      p_Var15[1]._M_parent = p_Var19;
      *(undefined8 *)(p_Var15 + 2) = 0;
      p_Var15[2]._M_parent = (_Base_ptr)0x0;
      p_Var15[2]._M_left = (_Base_ptr)0x0;
      p_Var15[2]._M_right = (_Base_ptr)0x0;
      p_Var15[3]._M_parent = (_Base_ptr)0x0;
      p_Var15[3]._M_left = (_Base_ptr)0x0;
      p_Var15[3]._M_right = (_Base_ptr)0x0;
      *(undefined8 *)(p_Var15 + 4) = 0;
      if (p_Var16 == p_Var17) {
        if ((local_48 == 0) ||
           (__p = b_00,
           bVar12 = ::operator<((base_blob<256U> *)(local_50 + 1),(base_blob<256U> *)b_00), !bVar12)
           ) {
          __p = b_00;
          pVar24 = std::
                   _Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
                   ::_M_get_insert_unique_pos
                             ((_Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
                               *)local_70,(key_type *)b_00);
        }
        else {
LAB_0035832c:
          auVar8._8_8_ = 0;
          auVar8._0_8_ = local_50;
          pVar24 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar8 << 0x40);
        }
        goto LAB_0035834f;
      }
      b = (_Link_type)(p_Var16 + 1);
      __p = b;
      bVar12 = ::operator<((base_blob<256U> *)b_00,(base_blob<256U> *)b);
      if (bVar12) {
        pVar24.second = p_Stack_58;
        pVar24.first = p_Stack_58;
        if (p_Stack_58 == p_Var16) {
LAB_0035834f:
          p_Var16 = pVar24.first;
          if (pVar24.second == (_Rb_tree_node_base *)0x0) goto LAB_00358395;
        }
        else {
          p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_decrement((_Rb_tree_node_base *)p_Var16);
          __p = b_00;
          bVar12 = ::operator<((base_blob<256U> *)(p_Var16 + 1),(base_blob<256U> *)b_00);
          if (!bVar12) {
            __p = b_00;
            pVar24 = std::
                     _Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
                     ::_M_get_insert_unique_pos
                               ((_Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
                                 *)local_70,(key_type *)b_00);
            goto LAB_0035834f;
          }
          pVar24 = pVar6;
          if (p_Var16->_M_right != (_Base_ptr)0x0) goto LAB_0035834f;
LAB_00358319:
          auVar7._8_8_ = 0;
          auVar7._0_8_ = p_Var16;
          pVar24 = (pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*>)(auVar7 << 0x40);
        }
        p_Var16 = pVar24.second;
        bVar12 = true;
        if ((pVar24.first == (_Rb_tree_node_base *)0x0) &&
           ((_Rb_tree_node_base *)(local_70 + 8) != p_Var16)) {
          bVar12 = ::operator<((base_blob<256U> *)b_00,(base_blob<256U> *)(p_Var16 + 1));
        }
        std::_Rb_tree_insert_and_rebalance
                  (bVar12,(_Rb_tree_node_base *)p_Var15,(_Rb_tree_node_base *)p_Var16,
                   (_Rb_tree_node_base *)(local_70 + 8));
        local_48 = local_48 + 1;
        p_Var16 = p_Var15;
      }
      else {
        __p = b_00;
        bVar12 = ::operator<((base_blob<256U> *)b,(base_blob<256U> *)b_00);
        if (bVar12) {
          if (local_50 == p_Var16) goto LAB_0035832c;
          p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var16);
          pVar24.second = p_Var17;
          pVar24.first = p_Var17;
          __p = (_Link_type)(p_Var17 + 1);
          bVar12 = ::operator<((base_blob<256U> *)b_00,(base_blob<256U> *)__p);
          if (bVar12) {
            if (p_Var16->_M_right == (_Base_ptr)0x0) goto LAB_00358319;
          }
          else {
            __p = b_00;
            pVar24 = std::
                     _Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
                     ::_M_get_insert_unique_pos
                               ((_Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
                                 *)local_70,(key_type *)b_00);
          }
          goto LAB_0035834f;
        }
LAB_00358395:
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
        ::_M_drop_node((_Rb_tree<uint256,_std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>,_std::_Select1st<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_(anonymous_namespace)::TxHashInfo>_>_>
                        *)p_Var15,__p);
      }
    }
    *(ulong *)(p_Var16 + 2) =
         *(long *)(p_Var16 + 2) +
         (ulong)(*(ulong *)((long)_Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>.
                                  _M_head_impl + 0x30) < 0x2000000000000000);
    p_Var16[2]._M_parent =
         (_Base_ptr)
         ((long)&(p_Var16[2]._M_parent)->_M_color +
         (ulong)((*(ulong *)((long)_Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>.
                                   _M_head_impl + 0x30) & 0xe000000000000000) == 0x2000000000000000)
         );
    p_Var16[2]._M_left =
         (_Base_ptr)
         ((long)&(p_Var16[2]._M_left)->_M_color +
         (ulong)((*(ulong *)((long)_Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>.
                                   _M_head_impl + 0x30) & 0xe000000000000000) == 0x4000000000000000)
         );
    p_Var16[2]._M_right =
         (_Base_ptr)
         ((long)&(p_Var16[2]._M_right)->_M_color +
         (ulong)((*(ulong *)((long)_Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>.
                                   _M_head_impl + 0x30) & 0xe000000000000000) == 0x6000000000000000)
         );
    uVar22 = *(ulong *)((long)_Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>.
                              _M_head_impl + 0x30);
    if ((uVar22 & 0xe000000000000000) == 0x4000000000000000) {
      PVar18 = anon_unknown.dwarf_b8b207::PriorityComputer::operator()
                         (&this->m_computer,
                          (Announcement *)
                          _Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl);
      *(Priority *)(p_Var16 + 3) = PVar18;
      uVar22 = *(ulong *)((long)_Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>.
                                _M_head_impl + 0x30);
    }
    if ((uVar22 & 0xe000000000000000) == 0x2000000000000000) {
      p_Var19 = (_Base_ptr)
                anon_unknown.dwarf_b8b207::PriorityComputer::operator()
                          (&this->m_computer,
                           (Announcement *)
                           _Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl);
      if (p_Var19 < p_Var16[3]._M_parent) {
        p_Var19 = p_Var16[3]._M_parent;
      }
      p_Var16[3]._M_parent = p_Var19;
    }
    std::vector<long,_std::allocator<long>_>::push_back
              ((vector<long,_std::allocator<long>_> *)&p_Var16[3]._M_left,
               (value_type_conflict3 *)
               ((long)_Var11.super__Head_base<2UL,_const_unsigned_long_&,_false>._M_head_impl + 0x28
               ));
    boost::multi_index::detail::
    ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
    ::increment((ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                 **)&local_88);
  } while( true );
}

Assistant:

void SanityCheck() const
    {
        // Recompute m_peerdata from m_index. This verifies the data in it as it should just be caching statistics
        // on m_index. It also verifies the invariant that no PeerInfo announcements with m_total==0 exist.
        assert(m_peerinfo == RecomputePeerInfo(m_index));

        // Calculate per-txhash statistics from m_index, and validate invariants.
        for (auto& item : ComputeTxHashInfo(m_index, m_computer)) {
            TxHashInfo& info = item.second;

            // Cannot have only COMPLETED peer (txhash should have been forgotten already)
            assert(info.m_candidate_delayed + info.m_candidate_ready + info.m_candidate_best + info.m_requested > 0);

            // Can have at most 1 CANDIDATE_BEST/REQUESTED peer
            assert(info.m_candidate_best + info.m_requested <= 1);

            // If there are any CANDIDATE_READY announcements, there must be exactly one CANDIDATE_BEST or REQUESTED
            // announcement.
            if (info.m_candidate_ready > 0) {
                assert(info.m_candidate_best + info.m_requested == 1);
            }

            // If there is both a CANDIDATE_READY and a CANDIDATE_BEST announcement, the CANDIDATE_BEST one must be
            // at least as good (equal or higher priority) as the best CANDIDATE_READY.
            if (info.m_candidate_ready && info.m_candidate_best) {
                assert(info.m_priority_candidate_best >= info.m_priority_best_candidate_ready);
            }

            // No txhash can have been announced by the same peer twice.
            std::sort(info.m_peers.begin(), info.m_peers.end());
            assert(std::adjacent_find(info.m_peers.begin(), info.m_peers.end()) == info.m_peers.end());
        }
    }